

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

Vec_Wrd_t * Gia_ManSimCombine(int nInputs,Vec_Wrd_t *vBase,Vec_Wrd_t *vAddOn,int nWordsUse)

{
  int iVar1;
  int iVar2;
  Vec_Wrd_t *p;
  word *pwVar3;
  word *pwVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar5 = (long)vBase->nSize / (long)nInputs;
  iVar2 = vAddOn->nSize / nInputs;
  iVar1 = (int)uVar5;
  p = Vec_WrdAlloc((iVar1 + nWordsUse) * nInputs);
  if (vBase->nSize % nInputs != 0) {
    __assert_fail("Vec_WrdSize(vBase) % nInputs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x109,"Vec_Wrd_t *Gia_ManSimCombine(int, Vec_Wrd_t *, Vec_Wrd_t *, int)");
  }
  if (vAddOn->nSize % nInputs != 0) {
    __assert_fail("Vec_WrdSize(vAddOn) % nInputs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x10a,"Vec_Wrd_t *Gia_ManSimCombine(int, Vec_Wrd_t *, Vec_Wrd_t *, int)");
  }
  if (iVar2 < nWordsUse) {
    __assert_fail("nWordsUse <= nWordsAddOn",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x10b,"Vec_Wrd_t *Gia_ManSimCombine(int, Vec_Wrd_t *, Vec_Wrd_t *, int)");
  }
  uVar8 = 0;
  uVar9 = 0;
  if (0 < iVar1) {
    uVar9 = uVar5 & 0xffffffff;
  }
  uVar5 = (ulong)(uint)nWordsUse;
  if (nWordsUse < 1) {
    uVar5 = uVar8;
  }
  uVar6 = (ulong)(uint)nInputs;
  if (nInputs < 1) {
    uVar6 = uVar8;
  }
  while (iVar7 = (int)uVar8, iVar7 != (int)uVar6) {
    if (iVar1 == 0) {
      pwVar3 = (word *)0x0;
    }
    else {
      pwVar3 = Vec_WrdEntryP(vBase,iVar7 * iVar1);
    }
    if (iVar2 == 0) {
      pwVar4 = (word *)0x0;
    }
    else {
      pwVar4 = Vec_WrdEntryP(vAddOn,iVar7 * iVar2);
    }
    for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      Vec_WrdPush(p,pwVar3[uVar8]);
    }
    for (uVar8 = 0; uVar5 != uVar8; uVar8 = uVar8 + 1) {
      Vec_WrdPush(p,pwVar4[uVar8]);
    }
    uVar8 = (ulong)(iVar7 + 1);
  }
  if ((0xf < p->nSize) && (p->nSize != p->nCap)) {
    __assert_fail("Vec_WrdSize(vSimsIn) == Vec_WrdCap(vSimsIn) || Vec_WrdSize(vSimsIn) < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x115,"Vec_Wrd_t *Gia_ManSimCombine(int, Vec_Wrd_t *, Vec_Wrd_t *, int)");
  }
  return p;
}

Assistant:

Vec_Wrd_t * Gia_ManSimCombine( int nInputs, Vec_Wrd_t * vBase, Vec_Wrd_t * vAddOn, int nWordsUse )
{
    int nWordsBase  = Vec_WrdSize(vBase)  / nInputs;
    int nWordsAddOn = Vec_WrdSize(vAddOn) / nInputs; int i, w;
    Vec_Wrd_t * vSimsIn = Vec_WrdAlloc( nInputs * (nWordsBase + nWordsUse) );
    assert( Vec_WrdSize(vBase)  % nInputs == 0 );
    assert( Vec_WrdSize(vAddOn) % nInputs == 0 );
    assert( nWordsUse <= nWordsAddOn );
    for ( i = 0; i < nInputs; i++ )
    {
        word * pSimsB = nWordsBase  ? Vec_WrdEntryP( vBase,  i * nWordsBase )  : NULL;
        word * pSimsA = nWordsAddOn ? Vec_WrdEntryP( vAddOn, i * nWordsAddOn ) : NULL;
        for ( w = 0; w < nWordsBase; w++ )
            Vec_WrdPush( vSimsIn, pSimsB[w] );
        for ( w = 0; w < nWordsUse; w++ )
            Vec_WrdPush( vSimsIn, pSimsA[w] );
    }
    assert( Vec_WrdSize(vSimsIn) == Vec_WrdCap(vSimsIn) || Vec_WrdSize(vSimsIn) < 16 );
    return vSimsIn;
}